

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcSpfd.c
# Opt level: O2

Vec_Wrd_t * Bdc_SpfdReadFiles6(Vec_Int_t **pvWeights)

{
  Vec_Wrd_t *pVVar1;
  FILE *pFVar2;
  Vec_Int_t *pVVar3;
  
  pVVar1 = Vec_WrdStart(0xc2f537);
  pFVar2 = fopen("func6v6n_bin.txt","rb");
  fread(pVVar1->pArray,8,(long)pVVar1->nSize,pFVar2);
  fclose(pFVar2);
  pVVar3 = Vec_IntStart(0xc2f537);
  pFVar2 = fopen("func6v6nW_bin.txt","rb");
  fread(pVVar3->pArray,4,(long)pVVar3->nSize,pFVar2);
  fclose(pFVar2);
  *pvWeights = pVVar3;
  return pVVar1;
}

Assistant:

Vec_Wrd_t * Bdc_SpfdReadFiles6( Vec_Int_t ** pvWeights )
{
    Vec_Int_t * vWeights;
    Vec_Wrd_t * vDivs = Vec_WrdStart( 12776759 );
    FILE * pFile = fopen( "func6v6n_bin.txt", "rb" );
    int RetValue;
    RetValue = fread( Vec_WrdArray(vDivs), sizeof(word), Vec_WrdSize(vDivs), pFile );
    fclose( pFile );

    vWeights = Vec_IntStart( 12776759 );
    pFile = fopen( "func6v6nW_bin.txt", "rb" );
    RetValue = fread( Vec_IntArray(vWeights), sizeof(int), Vec_IntSize(vWeights), pFile );
    fclose( pFile );

    *pvWeights = vWeights;
    return vDivs;
}